

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O1

void __thiscall cppurses::Text_display::insert(Text_display *this,Glyph_string *text,size_t index)

{
  byte bVar1;
  pointer pGVar2;
  pointer pGVar3;
  pointer pGVar4;
  pointer pGVar5;
  long lVar6;
  vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_> vStack_28;
  
  pGVar2 = (this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
           super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar3 = (this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
           super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (index <= (ulong)(((long)pGVar3 - (long)pGVar2 >> 3) * -0x5555555555555555)) {
    if (pGVar2 != pGVar3) {
      pGVar3 = (text->super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>).
               super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
               super__Vector_impl_data._M_start;
      pGVar4 = (text->super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>).
               super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pGVar5 = pGVar3;
      do {
        if (pGVar5 == pGVar4) {
          std::vector<cppurses::Glyph,std::allocator<cppurses::Glyph>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<cppurses::Glyph*,std::vector<cppurses::Glyph,std::allocator<cppurses::Glyph>>>>
                    ((vector<cppurses::Glyph,std::allocator<cppurses::Glyph>> *)&this->contents_,
                     pGVar2 + index,pGVar3,pGVar4);
          (*(this->super_Widget)._vptr_Widget[3])(this);
          sig::
          Signal_impl<void(cppurses::Glyph_string_const&),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(cppurses::Glyph_string_const&)>,std::mutex>
          ::operator()((Signal_impl<void(cppurses::Glyph_string_const&),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(cppurses::Glyph_string_const&)>,std::mutex>
                        *)(this->contents_modified).pimpl_.
                          super___shared_ptr<sig::Signal_impl<void_(const_cppurses::Glyph_string_&),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(const_cppurses::Glyph_string_&)>,_std::mutex>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,&this->contents_);
          return;
        }
        lVar6 = 0;
        do {
          bVar1 = (&Attribute_list)[lVar6];
          if (((this->insert_brush).attributes_.super__Base_bitset<1UL>._M_w >>
               ((long)(char)bVar1 & 0x3fU) & 1) != 0) {
            if (7 < bVar1) {
              std::__throw_out_of_range_fmt
                        ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",
                         (long)(char)bVar1,8);
            }
            (pGVar5->brush).attributes_.super__Base_bitset<1UL>._M_w =
                 (pGVar5->brush).attributes_.super__Base_bitset<1UL>._M_w | 1L << (bVar1 & 0x3f);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 8);
        pGVar5 = pGVar5 + 1;
      } while( true );
    }
    std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::vector
              (&vStack_28,&text->super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>);
    append(this,(Glyph_string *)&vStack_28);
    std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::~vector(&vStack_28);
  }
  return;
}

Assistant:

void Text_display::insert(Glyph_string text, std::size_t index) {
    if (index > contents_.size()) {
        return;
    }
    if (contents_.empty()) {
        this->append(std::move(text));
        return;
    }
    for (auto& glyph : text) {
        for (Attribute a : Attribute_list) {
            if (this->insert_brush.has_attribute(a)) {
                glyph.brush.add_attributes(a);
            }
        }
    }
    contents_.insert(std::begin(contents_) + index, std::begin(text),
                     std::end(text));
    this->update();
    contents_modified(contents_);
}